

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_posix_convert.cpp
# Opt level: O2

void test_char<wchar_t>(void)

{
  int iVar1;
  bool bVar2;
  wint_t wVar3;
  ostream *poVar4;
  __locale_t __locale;
  runtime_error *this;
  allocator local_253;
  allocator local_252;
  allocator local_251;
  generator gen;
  string name;
  locale l_1;
  locale l;
  string local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  string local_160;
  string local_140;
  string local_120;
  string local_100;
  string local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  booster::locale::generator::generator(&gen);
  poVar4 = std::operator<<((ostream *)&std::cout,"- Testing at least C");
  std::endl<char,std::char_traits<char>>(poVar4);
  std::__cxx11::string::string((string *)&name,"en_US.UTF-8",(allocator *)&l_1);
  booster::locale::generator::generate((string *)&l);
  std::__cxx11::string::~string((string *)&name);
  std::__cxx11::string::string((string *)&local_40,"Hello World i",(allocator *)&name);
  std::__cxx11::string::string((string *)&local_60,"hello world i",(allocator *)&l_1);
  std::__cxx11::string::string((string *)&local_80,"HELLO WORLD I",&local_253);
  test_one<wchar_t>(&l,&local_40,&local_60,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string((string *)&name,"en_US.UTF-8",(allocator *)&l_1);
  bVar2 = have_locale(&name);
  if (bVar2) {
    poVar4 = std::operator<<((ostream *)&std::cout,"- Testing ");
    poVar4 = std::operator<<(poVar4,(string *)&name);
    std::endl<char,std::char_traits<char>>(poVar4);
    booster::locale::generator::generate((string *)&l_1);
    std::__cxx11::string::string((string *)&local_a0,anon_var_dwarf_38bc,&local_253);
    std::__cxx11::string::string((string *)&local_c0,anon_var_dwarf_38c6,&local_251);
    std::__cxx11::string::string((string *)&local_e0,anon_var_dwarf_38d0,&local_252);
    test_one<wchar_t>(&l_1,&local_a0,&local_c0,&local_e0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::locale::~locale(&l_1);
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cout,"- en_US.UTF-8 is not supported, skipping");
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  std::__cxx11::string::assign((char *)&name);
  bVar2 = have_locale(&name);
  if (bVar2) {
    poVar4 = std::operator<<((ostream *)&std::cout,"Testing ");
    poVar4 = std::operator<<(poVar4,(string *)&name);
    std::endl<char,std::char_traits<char>>(poVar4);
    booster::locale::generator::generate((string *)&l_1);
    std::__cxx11::string::string((string *)&local_100,"Hello World",&local_253);
    std::__cxx11::string::string((string *)&local_120,"hello world",&local_251);
    std::__cxx11::string::string((string *)&local_140,"HELLO WORLD",&local_252);
    test_one<wchar_t>(&l_1,&local_100,&local_120,&local_140);
    std::__cxx11::string::~string((string *)&local_140);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::string((string *)&local_160,anon_var_dwarf_38bc,&local_253);
    std::__cxx11::string::string((string *)&local_180,anon_var_dwarf_38c6,&local_251);
    std::__cxx11::string::string((string *)&local_1a0,anon_var_dwarf_38d0,&local_252);
    test_one<wchar_t>(&l_1,&local_160,&local_180,&local_1a0);
    std::__cxx11::string::~string((string *)&local_1a0);
    std::__cxx11::string::~string((string *)&local_180);
    std::__cxx11::string::~string((string *)&local_160);
    std::locale::~locale(&l_1);
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cout,"- en_US.ISO8859-1 is not supported, skipping");
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  std::__cxx11::string::assign((char *)&name);
  bVar2 = have_locale(&name);
  if (bVar2) {
    poVar4 = std::operator<<((ostream *)&std::cout,"Testing ");
    poVar4 = std::operator<<(poVar4,(string *)&name);
    std::endl<char,std::char_traits<char>>(poVar4);
    __locale = newlocale(0x1fbf,name._M_dataplus._M_p,(__locale_t)0x0);
    test_counter = test_counter + 1;
    if (__locale == (__locale_t)0x0) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x4c);
      poVar4 = std::operator<<(poVar4," cl");
      std::endl<char,std::char_traits<char>>(poVar4);
      iVar1 = error_counter + 1;
      bVar2 = 0x14 < error_counter;
      error_counter = iVar1;
      if (bVar2) {
        this = (runtime_error *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string
                  ((string *)&l_1,"Error limits reached, stopping unit test",&local_253);
        booster::runtime_error::runtime_error(this,(string *)&l_1);
        __cxa_throw(this,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
      }
    }
    wVar3 = towupper_l(0x69,__locale);
    if (wVar3 == 0x130) {
      booster::locale::generator::generate((string *)&l_1);
      std::__cxx11::string::string((string *)&local_1c0,"i",&local_253);
      std::__cxx11::string::string((string *)&local_1e0,"i",&local_251);
      std::__cxx11::string::string((string *)&local_200,anon_var_dwarf_398e,&local_252);
      test_one<wchar_t>(&l_1,&local_1c0,&local_1e0,&local_200);
      std::__cxx11::string::~string((string *)&local_200);
      std::__cxx11::string::~string((string *)&local_1e0);
      std::__cxx11::string::~string((string *)&local_1c0);
      std::locale::~locale(&l_1);
    }
    else {
      poVar4 = std::operator<<((ostream *)&std::cout,"  Turkish locale is not supported well");
      std::endl<char,std::char_traits<char>>(poVar4);
    }
    if (__locale != (__locale_t)0x0) {
      freelocale(__locale);
    }
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cout,"- tr_TR.UTF-8 is not supported, skipping");
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  std::__cxx11::string::~string((string *)&name);
  std::locale::~locale(&l);
  booster::locale::generator::~generator(&gen);
  return;
}

Assistant:

void test_char()
{
    booster::locale::generator gen;

    std::cout << "- Testing at least C" << std::endl;

    std::locale l = gen("en_US.UTF-8");

    test_one<CharType>(l,"Hello World i","hello world i","HELLO WORLD I");

    std::string name = "en_US.UTF-8";
    if(have_locale(name)) {
        std::cout << "- Testing " << name << std::endl;
        std::locale l=gen(name);
        test_one<CharType>(l,"Façade","façade","FAÇADE");
    }
    else {
        std::cout << "- en_US.UTF-8 is not supported, skipping" << std::endl;
    }

    name = "en_US.ISO8859-1";
    if(have_locale(name)) {
        std::cout << "Testing " << name << std::endl;
        std::locale l=gen(name);
        test_one<CharType>(l,"Hello World","hello world","HELLO WORLD");
        #if defined(__APPLE__) || defined(__FreeBSD__)
        if(sizeof(CharType)!=1)
        #endif
            test_one<CharType>(l,"Façade","façade","FAÇADE");
    }
    else {
        std::cout << "- en_US.ISO8859-1 is not supported, skipping" << std::endl;
    }
    
    name = "tr_TR.UTF-8";
    if(have_locale(name)) {
        std::cout << "Testing " << name << std::endl;
        locale_t cl = newlocale(LC_ALL_MASK,name.c_str(),0);
        try { 
            TEST(cl);
            if(towupper_l(L'i',cl) == 0x130) {
                test_one<CharType>(gen(name),"i","i","İ");
            }
            else {
                std::cout <<"  Turkish locale is not supported well" << std::endl;
            }
        }
        catch(...) {
            if(cl) freelocale(cl);
            throw;
        }
        if(cl) freelocale(cl);
        
    }
    else 
    {
        std::cout << "- tr_TR.UTF-8 is not supported, skipping" << std::endl;
    }
}